

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signpost_intrinsic_triangulation.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::SignpostIntrinsicTriangulation::resolveNewVertex
          (SignpostIntrinsicTriangulation *this,Vertex newV,SurfacePoint intrinsicPoint)

{
  Edge e;
  Edge e_00;
  Vertex e_01;
  Vertex e_02;
  Vertex e_03;
  Vertex e_04;
  Vertex e_05;
  Vertex e_06;
  Vertex e_07;
  Vertex e_08;
  Vertex e_09;
  Vertex e_10;
  Halfedge e_11;
  Halfedge e_12;
  Vertex vert;
  Halfedge he_00;
  Halfedge he_01;
  Face f_00;
  Halfedge he_02;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  SurfacePoint startP;
  bool bVar3;
  SurfacePoint *pSVar4;
  runtime_error *this_00;
  double *pdVar5;
  Vector2 *pVVar6;
  long in_RDI;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Vertex VVar13;
  Halfedge HVar14;
  Vector2 VVar15;
  int in_stack_00000008;
  double in_stack_00000030;
  Halfedge currHe;
  Halfedge firstHe;
  double incomingAngle;
  TraceGeodesicResult inputTraceResult;
  TraceOptions options;
  double thisT;
  double localT;
  Halfedge he;
  NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> __end4;
  NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> __begin4;
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *__range4;
  Vertex prevVOrig;
  Vertex nextVOrig;
  Vertex prevV;
  Vertex nextV;
  Edge origEdge;
  double tNext;
  double tPrev;
  bool boundaryEdgeInsertion;
  Vector2 outgoingVec;
  SurfacePoint newPositionOnInput;
  tuple<int,_double> priorityThis;
  SurfacePoint candidateLoc;
  int numScore;
  double thisLen;
  Halfedge heIn_1;
  NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> __end2_2;
  NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> __begin2_2;
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *__range2_2;
  tuple<int,_double> priorityBest;
  Halfedge inputTraceHe;
  Face f;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator> __end2_1;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator> __begin2_1;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentFaceNavigator> *__range2_1;
  Halfedge heIn;
  NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> __end2;
  NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> __begin2;
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *__range2;
  NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>
  *in_stack_fffffffffffff788;
  SurfacePoint *in_stack_fffffffffffff790;
  ParentMeshT *in_stack_fffffffffffff798;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>
  *in_stack_fffffffffffff7a0;
  SignpostIntrinsicTriangulation *in_stack_fffffffffffff7a8;
  ParentMeshT *in_stack_fffffffffffff7b0;
  size_t in_stack_fffffffffffff7b8;
  Edge *in_stack_fffffffffffff7d8;
  SignpostIntrinsicTriangulation *in_stack_fffffffffffff7f0;
  ParentMeshT *in_stack_fffffffffffff7f8;
  size_t in_stack_fffffffffffff800;
  bool local_7d2;
  bool local_7d1;
  SignpostIntrinsicTriangulation *in_stack_fffffffffffff8e0;
  ParentMeshT *in_stack_fffffffffffff8e8;
  SignpostIntrinsicTriangulation *in_stack_fffffffffffff8f0;
  SignpostIntrinsicTriangulation *this_01;
  ParentMeshT *in_stack_fffffffffffff8f8;
  ParentMeshT *pPVar16;
  size_t in_stack_fffffffffffff900;
  ParentMeshT *pPVar17;
  double local_6e0;
  undefined1 local_670 [40];
  undefined1 auStack_648 [24];
  undefined1 local_628 [24];
  undefined1 auStack_610 [40];
  undefined1 auStack_5e8 [24];
  Vector2 local_5b8;
  TraceOptions local_5a0;
  ParentMeshT *local_588;
  size_t local_580;
  undefined1 local_578 [88];
  undefined8 local_520;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_500;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_4f0;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_4e0;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_4d0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_4c0;
  NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> local_4b0 [2];
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> local_480;
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *local_458;
  ParentMeshT *local_450;
  size_t local_448;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_440;
  ParentMeshT *local_430;
  size_t local_428;
  ParentMeshT *local_420;
  size_t local_418;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_410;
  ParentMeshT *local_400;
  size_t local_3f8;
  ParentMeshT *local_3f0;
  size_t local_3e8;
  ParentMeshT *local_3e0;
  size_t local_3d8;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_3d0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_3c0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_3b0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_3a0;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_390;
  ParentMeshT *local_380;
  size_t local_378;
  ParentMeshT *local_370;
  size_t local_368;
  TraceOptions *in_stack_fffffffffffffca0;
  IntrinsicGeometryInterface *in_stack_fffffffffffffca8;
  Vector2 in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcd0;
  ParentMeshT *pPVar18;
  undefined8 in_stack_fffffffffffffcd8;
  size_t sVar19;
  ParentMeshT *in_stack_fffffffffffffce0;
  size_t in_stack_fffffffffffffce8;
  undefined8 in_stack_fffffffffffffcf0;
  double dVar20;
  undefined8 in_stack_fffffffffffffcf8;
  double dVar21;
  undefined1 in_stack_fffffffffffffd00 [16];
  undefined8 in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 local_2c8 [24];
  undefined1 auStack_2b0 [40];
  undefined1 auStack_288 [24];
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_258;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_248;
  int local_238 [23];
  undefined4 local_1dc;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_1d8;
  double local_1c8;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_1c0;
  NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> local_1b0 [2];
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> local_180;
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *local_158;
  undefined4 local_150;
  undefined4 local_14c;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_138;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_128;
  ParentMeshT *local_118;
  size_t local_110;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_108;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator> local_f8 [2];
  NavigationSetBase<geometrycentral::surface::VertexAdjacentFaceNavigator> local_c8;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentFaceNavigator> *local_a0;
  ParentMeshT *local_98;
  size_t local_90;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_88;
  NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> local_78 [2];
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> local_48;
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *local_20;
  
  Vertex::incomingHalfedges((Vertex *)in_stack_fffffffffffff7b0);
  local_20 = &local_48;
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::begin
            ((NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *)
             in_stack_fffffffffffff7a0);
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::end
            (local_78,local_20);
  while (bVar3 = NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::
                 operator!=((NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>
                             *)in_stack_fffffffffffff790,in_stack_fffffffffffff788), bVar3) {
    local_88 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::
               operator*((NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>
                          *)0x2c86e6);
    local_98 = local_88.mesh;
    local_90 = local_88.ind;
    HVar14.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    ind = in_stack_fffffffffffff900;
    HVar14.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    mesh = in_stack_fffffffffffff8f8;
    updateAngleFromCWNeighor(in_stack_fffffffffffff8f0,HVar14);
    NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::operator++
              ((NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *)
               in_stack_fffffffffffff790);
  }
  Vertex::adjacentFaces((Vertex *)in_stack_fffffffffffff7a0);
  local_a0 = &local_c8;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentFaceNavigator>::begin
            ((NavigationSetBase<geometrycentral::surface::VertexAdjacentFaceNavigator> *)
             in_stack_fffffffffffff7a0);
  NavigationSetBase<geometrycentral::surface::VertexAdjacentFaceNavigator>::end(local_f8,local_a0);
  while (bVar3 = NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator>::
                 operator!=((NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator>
                             *)in_stack_fffffffffffff790,
                            (NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator>
                             *)in_stack_fffffffffffff788), bVar3) {
    local_108 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
                NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator>::
                operator*((NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator>
                           *)0x2c87bc);
    local_118 = local_108.mesh;
    local_110 = local_108.ind;
    f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffff8f0;
    f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffff8e8;
    updateFaceBasis(in_stack_fffffffffffff8e0,f_00);
    NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator>::operator++
              ((NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator> *)
               in_stack_fffffffffffff790);
  }
  local_138 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
              Vertex::halfedge((Vertex *)in_stack_fffffffffffff790);
  local_128 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
              Halfedge::twin((Halfedge *)in_stack_fffffffffffff790);
  local_14c = 9999;
  local_150 = 0;
  ::std::tuple<int,_double>::tuple<int,_int,_true>
            ((tuple<int,_double> *)in_stack_fffffffffffff790,(int *)in_stack_fffffffffffff788,
             (int *)0x2c8888);
  Vertex::incomingHalfedges((Vertex *)in_stack_fffffffffffff7b0);
  local_158 = &local_180;
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::begin
            ((NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *)
             in_stack_fffffffffffff7a0);
  NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::end
            (local_1b0,local_158);
  while (bVar3 = NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::
                 operator!=((NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>
                             *)in_stack_fffffffffffff790,in_stack_fffffffffffff788), bVar3) {
    local_1c0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
                NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::
                operator*((NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>
                           *)0x2c8902);
    local_1d8 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::edge((Halfedge *)in_stack_fffffffffffff790);
    e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffff7b0;
    e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)in_stack_fffffffffffff7a8;
    pdVar5 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                       ((MeshData<geometrycentral::surface::Edge,_double> *)
                        in_stack_fffffffffffff7a0,e_00);
    local_1c8 = *pdVar5;
    local_1dc = 2;
    local_248 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::vertex((Halfedge *)in_stack_fffffffffffff790);
    VVar13.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
    ind = (size_t)in_stack_fffffffffffff7b0;
    VVar13.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
    mesh = (ParentMeshT *)in_stack_fffffffffffff7a8;
    pSVar4 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>::
             operator[](in_stack_fffffffffffff7a0,VVar13);
    memcpy(local_238,pSVar4,0x58);
    if (local_238[0] == 0) {
      local_1dc = 1;
    }
    local_258 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::edge((Halfedge *)in_stack_fffffffffffff790);
    bVar3 = Edge::isBoundary(in_stack_fffffffffffff7d8);
    if (bVar3) {
      local_1dc = 3;
    }
    ::std::tuple<int,_double>::tuple<int_&,_double_&,_true>
              ((tuple<int,_double> *)in_stack_fffffffffffff790,(int *)in_stack_fffffffffffff788,
               (double *)0x2c8a52);
    bVar3 = ::std::operator<((tuple<int,_double> *)in_stack_fffffffffffff790,
                             (tuple<int,_double> *)in_stack_fffffffffffff788);
    if (bVar3) {
      ::std::tuple<int,_double>::operator=
                ((tuple<int,_double> *)in_stack_fffffffffffff790,(type)in_stack_fffffffffffff788);
      local_128 = local_1c0;
    }
    NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::operator++
              ((NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *)
               in_stack_fffffffffffff790);
  }
  SurfacePoint::SurfacePoint(in_stack_fffffffffffff790);
  local_7d1 = false;
  if (in_stack_00000008 == 1) {
    local_7d1 = Edge::isBoundary(in_stack_fffffffffffff7d8);
  }
  if (local_7d1 == false) {
    TraceOptions::TraceOptions(&local_5a0);
    in_stack_fffffffffffff800 = *(size_t *)(in_RDI + 0x10a8);
    in_stack_fffffffffffff7f8 = (ParentMeshT *)(in_RDI + 0x1198);
    Halfedge::vertex((Halfedge *)in_stack_fffffffffffff790);
    e_09.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
         = (size_t)in_stack_fffffffffffff7b0;
    e_09.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
         = (ParentMeshT *)in_stack_fffffffffffff7a8;
    pSVar4 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>::
             operator[](in_stack_fffffffffffff7a0,e_09);
    auVar8._0_4_ = pSVar4->type;
    auVar8._4_4_ = *(undefined4 *)&pSVar4->field_0x4;
    auVar8._8_16_ = *(undefined1 (*) [16])&pSVar4->vertex;
    auVar8._24_16_ = *(undefined1 (*) [16])&pSVar4->edge;
    auVar8._40_8_ = pSVar4->tEdge;
    auVar8._48_16_ = *(undefined1 (*) [16])&pSVar4->face;
    auVar7 = vmovdqu64_avx512f(auVar8);
    auVar9._0_16_ = *(undefined1 (*) [16])&pSVar4->edge;
    auVar9._16_8_ = pSVar4->tEdge;
    auVar9._24_16_ = *(undefined1 (*) [16])&pSVar4->face;
    auVar9._40_8_ = (pSVar4->faceCoords).x;
    auVar9._48_8_ = (pSVar4->faceCoords).y;
    auVar9._56_8_ = (pSVar4->faceCoords).z;
    auVar8 = vmovdqu64_avx512f(auVar9);
    auVar8 = vmovdqu64_avx512f(auVar8);
    auStack_648 = auVar8._40_24_;
    auVar8 = vmovdqu64_avx512f(auVar7);
    local_670 = auVar8._24_40_;
    he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    ind = in_stack_fffffffffffff800;
    he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    mesh = in_stack_fffffffffffff7f8;
    halfedgeVector(in_stack_fffffffffffff7f0,he_00);
    auVar8 = vmovdqu64_avx512f(auVar8);
    auVar7._40_24_ = auStack_648;
    auVar7._0_40_ = local_670;
    auVar9 = vmovdqu64_avx512f(auVar7);
    vmovdqu64_avx512f(auVar9);
    auVar8 = vmovdqu64_avx512f(auVar8);
    in_stack_fffffffffffff788 = auVar8._0_8_;
    in_stack_fffffffffffff790 = auVar8._8_8_;
    in_stack_fffffffffffff7a0 = auVar8._24_8_;
    in_stack_fffffffffffff7a8 = auVar8._32_8_;
    in_stack_fffffffffffff7b0 = auVar8._40_8_;
    in_stack_fffffffffffff7b8 = auVar8._48_8_;
    startP.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)in_stack_fffffffffffffcd8;
    startP._0_8_ = in_stack_fffffffffffffcd0;
    startP.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffffce0;
    startP.edge.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
    .mesh = (ParentMeshT *)in_stack_fffffffffffffce8;
    startP.edge.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
    .ind = in_stack_fffffffffffffcf0;
    startP.tEdge = (double)in_stack_fffffffffffffcf8;
    startP.face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
    .mesh = (ParentMeshT *)in_stack_fffffffffffffd00._0_8_;
    startP.face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
    .ind = in_stack_fffffffffffffd00._8_8_;
    startP.faceCoords.x = (double)in_stack_fffffffffffffd10;
    startP.faceCoords.y = (double)in_stack_fffffffffffffd18;
    startP.faceCoords.z._0_7_ = in_stack_fffffffffffffd20;
    startP.faceCoords.z._7_1_ = local_7d1;
    traceGeodesic(in_stack_fffffffffffffca8,startP,in_stack_fffffffffffffcb0,
                  in_stack_fffffffffffffca0);
    auVar1._24_40_ = auStack_610;
    auVar1._0_24_ = local_628;
    auVar9 = vmovdqu64_avx512f(auVar1);
    auVar2._40_24_ = auStack_5e8;
    auVar2._0_40_ = auStack_610;
    auVar8 = vmovdqu64_avx512f(auVar2);
    auVar8 = vmovdqu64_avx512f(auVar8);
    auStack_288 = auVar8._40_24_;
    auVar8 = vmovdqu64_avx512f(auVar9);
    local_2c8 = auVar8._0_24_;
    auStack_2b0 = auVar8._24_40_;
    Vector2::operator-(&local_5b8);
    TraceGeodesicResult::~TraceGeodesicResult((TraceGeodesicResult *)0x2c93c8);
  }
  else {
    Vertex::halfedge((Vertex *)in_stack_fffffffffffff790);
    local_128 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::twin((Halfedge *)in_stack_fffffffffffff790);
    Edge::Edge((Edge *)0x2c8b76);
    Vertex::halfedge((Vertex *)in_stack_fffffffffffff790);
    Halfedge::twin((Halfedge *)in_stack_fffffffffffff790);
    VVar13 = Halfedge::vertex((Halfedge *)in_stack_fffffffffffff790);
    pPVar18 = VVar13.
              super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
              .mesh;
    sVar19 = VVar13.
             super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
             ind;
    e_01.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
         = (size_t)in_stack_fffffffffffff7b0;
    e_01.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
         = (ParentMeshT *)in_stack_fffffffffffff7a8;
    pSVar4 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>::
             operator[](in_stack_fffffffffffff7a0,e_01);
    if (pSVar4->type == Vertex) {
      dVar20 = 1.0;
    }
    else {
      e_02.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffff7b0;
      e_02.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = (ParentMeshT *)in_stack_fffffffffffff7a8;
      local_370 = pPVar18;
      local_368 = sVar19;
      local_380 = pPVar18;
      local_378 = sVar19;
      pSVar4 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>::
               operator[](in_stack_fffffffffffff7a0,e_02);
      dVar20 = pSVar4->tEdge;
      e_03.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffff7b0;
      e_03.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = (ParentMeshT *)in_stack_fffffffffffff7a8;
      pPVar18 = local_380;
      sVar19 = local_378;
      pSVar4 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>::
               operator[](in_stack_fffffffffffff7a0,e_03);
      in_stack_fffffffffffffce0 =
           (pSVar4->edge).
           super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
      ;
      in_stack_fffffffffffffce8 =
           (pSVar4->edge).
           super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind;
    }
    local_3d0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
                Vertex::halfedge((Vertex *)in_stack_fffffffffffff790);
    local_3c0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::twin((Halfedge *)in_stack_fffffffffffff790);
    local_3b0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::next((Halfedge *)in_stack_fffffffffffff790);
    local_3a0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::twin((Halfedge *)in_stack_fffffffffffff790);
    local_390 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                Halfedge::vertex((Halfedge *)in_stack_fffffffffffff790);
    local_3e0 = local_390.mesh;
    local_3d8 = local_390.ind;
    e_04.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
         = (size_t)in_stack_fffffffffffff7b0;
    e_04.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
         = (ParentMeshT *)in_stack_fffffffffffff7a8;
    pSVar4 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>::
             operator[](in_stack_fffffffffffff7a0,e_04);
    if (pSVar4->type == Vertex) {
      dVar21 = 0.0;
    }
    else {
      local_3f0 = local_390.mesh;
      local_3e8 = local_390.ind;
      e_05.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffff7b0;
      e_05.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = (ParentMeshT *)in_stack_fffffffffffff7a8;
      pSVar4 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>::
               operator[](in_stack_fffffffffffff7a0,e_05);
      dVar21 = pSVar4->tEdge;
      local_400 = local_390.mesh;
      local_3f8 = local_390.ind;
      e_06.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffff7b0;
      e_06.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = (ParentMeshT *)in_stack_fffffffffffff7a8;
      pSVar4 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>::
               operator[](in_stack_fffffffffffff7a0,e_06);
      in_stack_fffffffffffffce0 =
           (pSVar4->edge).
           super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
      ;
      in_stack_fffffffffffffce8 =
           (pSVar4->edge).
           super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind;
    }
    Edge::Edge((Edge *)0x2c8e81);
    bVar3 = Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>::
            operator==((Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                        *)&stack0xfffffffffffffce0,&local_410);
    if (bVar3) {
      e_07.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffff7b0;
      e_07.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = (ParentMeshT *)in_stack_fffffffffffff7a8;
      local_430 = pPVar18;
      local_428 = sVar19;
      pSVar4 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>::
               operator[](in_stack_fffffffffffff7a0,e_07);
      local_420 = (pSVar4->vertex).
                  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                  .mesh;
      local_418 = (pSVar4->vertex).
                  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                  .ind;
      local_450 = local_390.mesh;
      local_448 = local_390.ind;
      e_08.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffff7b0;
      e_08.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = (ParentMeshT *)in_stack_fffffffffffff7a8;
      pSVar4 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>::
               operator[](in_stack_fffffffffffff7a0,e_08);
      local_440.mesh =
           (pSVar4->vertex).
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           mesh;
      local_440.ind =
           (pSVar4->vertex).
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           ind;
      Vertex::incomingHalfedges((Vertex *)in_stack_fffffffffffff7b0);
      local_458 = &local_480;
      NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::begin
                ((NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *)
                 in_stack_fffffffffffff7a0);
      NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::end
                (local_4b0,local_458);
      while (bVar3 = NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>
                     ::operator!=((NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>
                                   *)in_stack_fffffffffffff790,in_stack_fffffffffffff788), bVar3) {
        local_4c0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     )NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>
                      ::operator*((NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>
                                   *)0x2c8fd1);
        local_4d0 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                     )Halfedge::vertex((Halfedge *)in_stack_fffffffffffff790);
        bVar3 = Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>::
                operator==(&local_4d0,&local_440);
        local_7d2 = false;
        if (bVar3) {
          local_4e0 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                       )Halfedge::edge((Halfedge *)in_stack_fffffffffffff790);
          local_7d2 = Edge::isBoundary(in_stack_fffffffffffff7d8);
        }
        if (local_7d2 != false) {
          local_4f0 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                       )Halfedge::edge((Halfedge *)in_stack_fffffffffffff790);
          in_stack_fffffffffffffce0 = local_4f0.mesh;
          in_stack_fffffffffffffce8 = local_4f0.ind;
        }
        NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::
        operator++((NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>
                    *)in_stack_fffffffffffff790);
      }
    }
    Edge::Edge((Edge *)0x2c90c3);
    local_588 = in_stack_fffffffffffffce0;
    local_580 = in_stack_fffffffffffffce8;
    bVar3 = Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>::
            operator==((Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                        *)&stack0xfffffffffffffce0,&local_500);
    if (bVar3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,
                 "edge split problem: no boundary edge connecting vertices in boundary insertion");
      __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar21;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = 1.0 - in_stack_00000030;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = in_stack_00000030 * dVar20;
    auVar10 = vfmadd213sd_fma(auVar10,auVar11,auVar12);
    local_520 = auVar10._0_8_;
    e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffff7a0;
    e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffff798;
    SurfacePoint::SurfacePoint(in_stack_fffffffffffff790,e,(double)in_stack_fffffffffffff788);
    memcpy(local_2c8,local_578,0x58);
  }
  e_10.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
       (size_t)in_stack_fffffffffffff7b0;
  e_10.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)in_stack_fffffffffffff7a8;
  pSVar4 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>::
           operator[](in_stack_fffffffffffff7a0,e_10);
  memcpy(pSVar4,local_2c8,0x58);
  Vector2::arg((Vector2 *)0x2c9476);
  vert.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
       in_stack_fffffffffffff7b8;
  vert.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
       in_stack_fffffffffffff7b0;
  local_6e0 = standardizeAngle(in_stack_fffffffffffff7a8,vert,(double)in_stack_fffffffffffff7a0);
  bVar3 = Halfedge::isInterior((Halfedge *)0x2c94a9);
  if (!bVar3) {
    local_6e0 = 0.0;
  }
  HVar14 = Halfedge::twin((Halfedge *)in_stack_fffffffffffff790);
  pPVar17 = HVar14.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh;
  e_11.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
       = (size_t)in_stack_fffffffffffff7b0;
  e_11.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
       = (ParentMeshT *)in_stack_fffffffffffff7a8;
  pdVar5 = MeshData<geometrycentral::surface::Halfedge,_double>::operator[]
                     ((MeshData<geometrycentral::surface::Halfedge,_double> *)
                      in_stack_fffffffffffff7a0,e_11);
  *pdVar5 = local_6e0;
  Halfedge::twin((Halfedge *)in_stack_fffffffffffff790);
  he_01.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
       = in_stack_fffffffffffff800;
  he_01.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
  mesh = in_stack_fffffffffffff7f8;
  VVar15 = halfedgeVector(in_stack_fffffffffffff7f0,he_01);
  this_01 = (SignpostIntrinsicTriangulation *)VVar15.x;
  pPVar16 = (ParentMeshT *)VVar15.y;
  Halfedge::twin((Halfedge *)in_stack_fffffffffffff790);
  e_12.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
       = (size_t)in_stack_fffffffffffff7b0;
  e_12.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
       = (ParentMeshT *)in_stack_fffffffffffff7a8;
  pVVar6 = MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator[]
                     ((MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *)
                      in_stack_fffffffffffff7a0,e_12);
  pVVar6->x = (double)this_01;
  pVVar6->y = (double)pPVar16;
  Halfedge::twin((Halfedge *)in_stack_fffffffffffff790);
  Halfedge::next((Halfedge *)in_stack_fffffffffffff790);
  Halfedge::next((Halfedge *)in_stack_fffffffffffff790);
  Halfedge::twin((Halfedge *)in_stack_fffffffffffff790);
  do {
    he_02.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    ind = (size_t)pPVar17;
    he_02.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    mesh = pPVar16;
    updateAngleFromCWNeighor(this_01,he_02);
    bVar3 = Halfedge::isInterior((Halfedge *)0x2c9688);
    if (!bVar3) {
      return;
    }
    Halfedge::next((Halfedge *)in_stack_fffffffffffff790);
    Halfedge::next((Halfedge *)in_stack_fffffffffffff790);
    Halfedge::twin((Halfedge *)in_stack_fffffffffffff790);
    bVar3 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            operator!=((Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        *)in_stack_fffffffffffff790,
                       (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        *)in_stack_fffffffffffff788);
  } while (bVar3);
  return;
}

Assistant:

void SignpostIntrinsicTriangulation::resolveNewVertex(Vertex newV, SurfacePoint intrinsicPoint) {

  // == (1) Compute angular coordinates for the halfedges
  // Now that we have valid edge lengths, compute halfedge angular coordinates for our new vertex
  for (Halfedge heIn : newV.incomingHalfedges()) {
    updateAngleFromCWNeighor(heIn);
  }

  // == (2) Set up bases on the intrinsic faces
  for (Face f : newV.adjacentFaces()) {
    updateFaceBasis(f);
  }

  // == (3) Find the insertion point on the input mesh, use it to align tangent spaces

  // Heuristic: we have to choose some edge to trace from to resolve the vertex. Use the shortest one, as it will often
  // involve the fewest crossings. Furthermore, use an original vertex if possible to reduce accumulating numerical
  // error.
  /*
  Halfedge inputTraceHe = newV.halfedge().twin();
  double shortestTraceHeLen = intrinsicEdgeLengths[inputTraceHe.edge()];
  for (Halfedge heIn : newV.incomingHalfedges()) {
    double thisLen = intrinsicEdgeLengths[heIn.edge()];

    bool currVertIsOriginal = vertexLocations[inputTraceHe.vertex()].type == SurfacePointType::Vertex;
    bool newVertIsOriginal = vertexLocations[heIn.vertex()].type == SurfacePointType::Vertex;

    if (currVertIsOriginal && !newVertIsOriginal) continue;

    if ((newVertIsOriginal && !currVertIsOriginal) || thisLen < shortestTraceHeLen) {
      shortestTraceHeLen = thisLen;
      inputTraceHe = heIn;
    }
  }
  */


  // We have to choose some edge to trace from to resolve the vertex. Choose from neighbors according to the following
  // priority:
  //  (best)    original points
  //  (neutral) other points
  //  (worst)   boundary points
  //  [break ties by shortest edge length]
  Halfedge inputTraceHe = newV.halfedge().twin();
  std::tuple<int, double> priorityBest{9999, 0};
  for (Halfedge heIn : newV.incomingHalfedges()) {

    // length score
    double thisLen = intrinsicEdgeLengths[heIn.edge()];

    // type score
    int numScore = 2;
    SurfacePoint candidateLoc = vertexLocations[inputTraceHe.vertex()];
    if (candidateLoc.type == SurfacePointType::Vertex) {
      numScore = 1;
    }
    if (heIn.edge().isBoundary()) {
      numScore = 3;
    }

    // combined score
    std::tuple<int, double> priorityThis{numScore, thisLen};

    // keep best
    if (priorityThis < priorityBest) {
      priorityBest = priorityThis;
      inputTraceHe = heIn;
    }
  }

  // Trace from the adjacent vertex selected above to get the position/angle on the input mesh
  SurfacePoint newPositionOnInput;
  Vector2 outgoingVec;

  bool boundaryEdgeInsertion = (intrinsicPoint.type == SurfacePointType::Edge && intrinsicPoint.edge.isBoundary());
  if (boundaryEdgeInsertion) {
    // For boundary vertices, instead of tracing, directly interpolate along the edge
    inputTraceHe = newV.halfedge().twin();

    // Get t values along the edge for previous and next vertices (note that we must be along a single edge)
    double tPrev, tNext;
    Edge origEdge;

    Vertex nextV = newV.halfedge().twin().vertex();
    if (vertexLocations[nextV].type == SurfacePointType::Vertex) {
      tNext = 1.;
    } else /* SurfacePointType::Edge */ {
      tNext = vertexLocations[nextV].tEdge;
      origEdge = vertexLocations[nextV].edge;
    }

    Vertex prevV = newV.halfedge().twin().next().twin().vertex();
    if (vertexLocations[prevV].type == SurfacePointType::Vertex) {
      tPrev = 0.;
    } else /* SurfacePointType::Edge */ {
      tPrev = vertexLocations[prevV].tEdge;
      origEdge = vertexLocations[prevV].edge;
    }

    // If neither was along an edge, find the (should-be-unique) boundary edge connecting the vertices
    if (origEdge == Edge()) {
      Vertex nextVOrig = vertexLocations[nextV].vertex;
      Vertex prevVOrig = vertexLocations[prevV].vertex;

      for (Halfedge he : nextVOrig.incomingHalfedges()) {
        if (he.vertex() == prevVOrig && he.edge().isBoundary()) {
          origEdge = he.edge();
        }
      }
    }

    if (origEdge == Edge()) {
      throw std::runtime_error("edge split problem: no boundary edge connecting vertices in boundary insertion");
    }

    // Interpolate between the previous and next t values
    double localT = intrinsicPoint.tEdge;
    double thisT = (1. - localT) * tPrev + (localT)*tNext;

    newPositionOnInput = SurfacePoint(origEdge, thisT);
  } else {
    // Normal case: trace an edge inward, use the result to resolve position and tangent basis
    // std::cout << "tracing to resolve new vertex" << std::endl;
    TraceOptions options;

    TraceGeodesicResult inputTraceResult =
        traceGeodesic(inputGeom, vertexLocations[inputTraceHe.vertex()], halfedgeVector(inputTraceHe), options);
    // std::cout << " --> done tracing to resolve new vertex" << std::endl;
    // snapEndToEdgeIfClose(inputTraceResult); TODO
    newPositionOnInput = inputTraceResult.endPoint;
    outgoingVec = -inputTraceResult.endingDir;
  }


  // Set the location of our newly inserted vertex
  vertexLocations[newV] = newPositionOnInput;

  // Align the new vertex's tangent space to that of the input mesh.
  double incomingAngle = standardizeAngle(newV, outgoingVec.arg());
  if (!inputTraceHe.isInterior()) {
    incomingAngle = 0;
  }

  intrinsicHalfedgeDirections[inputTraceHe.twin()] = incomingAngle;
  // halfedgeVectorsInVertex[inputTraceHe.twin()] = outgoingVec.normalize() * intrinsicEdgeLengths[inputTraceHe.edge()];
  halfedgeVectorsInVertex[inputTraceHe.twin()] = halfedgeVector(inputTraceHe.twin());

  // Custom loop to orbit CCW from InputTraceHe
  Halfedge firstHe = inputTraceHe.twin();
  Halfedge currHe = firstHe.next().next().twin();
  do {
    updateAngleFromCWNeighor(currHe);
    if (!currHe.isInterior()) break;
    currHe = currHe.next().next().twin();
  } while (currHe != firstHe);
}